

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall CLI::Option::excludes(Option *this,Option *opt)

{
  undefined8 uVar1;
  Option *in_RSI;
  Option *in_RDI;
  undefined1 in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffff99;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
  *in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb1;
  undefined3 in_stack_ffffffffffffffb8;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffbc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffe8;
  
  if (in_RSI == in_RDI) {
    uVar2 = CONCAT13(1,in_stack_ffffffffffffffb8);
    uVar1 = __cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,(char *)CONCAT44(in_stack_ffffffffffffffbc,uVar2),
               (allocator<char> *)CONCAT71(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0));
    IncorrectConstruction::IncorrectConstruction
              ((IncorrectConstruction *)in_RSI,in_stack_ffffffffffffffe8);
    __cxa_throw(uVar1,&IncorrectConstruction::typeinfo,IncorrectConstruction::~IncorrectConstruction
               );
  }
  std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::insert
            (in_stack_ffffffffffffffa0,
             (value_type *)CONCAT71(in_stack_ffffffffffffff99,in_stack_ffffffffffffff98));
  std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::insert
            ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)in_RDI,
             (value_type *)CONCAT71(in_stack_ffffffffffffff99,in_stack_ffffffffffffff98));
  return in_RDI;
}

Assistant:

CLI11_INLINE Option *Option::excludes(Option *opt) {
    if(opt == this) {
        throw(IncorrectConstruction("and option cannot exclude itself"));
    }
    excludes_.insert(opt);

    // Help text should be symmetric - excluding a should exclude b
    opt->excludes_.insert(this);

    // Ignoring the insert return value, excluding twice is now allowed.
    // (Mostly to allow both directions to be excluded by user, even though the library does it for you.)

    return this;
}